

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::dispose
          (Own<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
           *this)

{
  ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *object;
  ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *ptrCopy;
  Own<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
  *this_local;
  
  object = this->ptr;
  if (object != (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)0x0) {
    this->ptr = (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)0x0;
    Disposer::
    dispose<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }